

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

string * __thiscall
inja::Environment::load_file(string *__return_storage_ptr__,Environment *this,string *filename)

{
  path local_200;
  path local_1d8;
  undefined1 local_1b0 [8];
  Parser parser;
  string *filename_local;
  Environment *this_local;
  
  parser.block_statement_stack.c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)filename;
  Parser::Parser((Parser *)local_1b0,&this->parser_config,&this->lexer_config,
                 &this->template_storage,&this->function_storage);
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             parser.block_statement_stack.c.
             super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node,auto_format);
  std::filesystem::__cxx11::operator/(&local_1d8,&this->input_path,&local_200);
  Parser::load_file(__return_storage_ptr__,&local_1d8);
  std::filesystem::__cxx11::path::~path(&local_1d8);
  std::filesystem::__cxx11::path::~path(&local_200);
  Parser::~Parser((Parser *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string load_file(const std::string& filename) {
    Parser parser(parser_config, lexer_config, template_storage, function_storage);
    return Parser::load_file(input_path / filename);
  }